

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentdelete.cpp
# Opt level: O2

void delete_elements(DuckDB *db,bool *correct,size_t threadnr)

{
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> _Var1;
  _Alloc_hider _Var2;
  char cVar3;
  pointer pMVar4;
  pointer *__ptr;
  unsigned_long __val;
  long lVar5;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_128;
  size_t local_120;
  long *local_118;
  bool *local_110;
  long *local_108;
  long *local_100;
  long local_f8;
  string local_f0;
  Connection con;
  Value count;
  Value new_count;
  
  correct[threadnr] = true;
  local_120 = threadnr;
  local_110 = correct;
  duckdb::Connection::Connection(&con,db);
  std::__cxx11::string::string((string *)&count,"BEGIN TRANSACTION;",(allocator *)&new_count);
  duckdb::Connection::Query((string *)&local_100);
  if (local_100 != (long *)0x0) {
    (**(code **)(*local_100 + 8))();
  }
  local_100 = (long *)0x0;
  std::__cxx11::string::~string((string *)&count);
  std::__cxx11::string::string
            ((string *)&count,"SELECT COUNT(*) FROM integers",(allocator *)&new_count);
  duckdb::Connection::Query((string *)&local_128);
  std::__cxx11::string::~string((string *)&count);
  pMVar4 = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)&local_128);
  duckdb::MaterializedQueryResult::GetValue((ulong)&count,(ulong)pMVar4);
  local_f8 = duckdb::Value::GetValue<long>();
  __val = local_120 * 100;
  for (lVar5 = -1; lVar5 != -0x65; lVar5 = lVar5 + -1) {
    std::__cxx11::to_string(&local_f0,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_count,
                   "DELETE FROM integers WHERE i=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0);
    duckdb::Connection::Query((string *)&local_118);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_118);
    cVar3 = duckdb::BaseQueryResult::HasError();
    if (local_118 != (long *)0x0) {
      (**(code **)(*local_118 + 8))();
    }
    local_118 = (long *)0x0;
    std::__cxx11::string::~string((string *)&new_count);
    std::__cxx11::string::~string((string *)&local_f0);
    if (cVar3 != '\0') {
      local_110[local_120] = false;
    }
    std::__cxx11::string::string
              ((string *)&new_count,"SELECT COUNT(*) FROM integers",(allocator *)&local_118);
    duckdb::Connection::Query((string *)&local_f0);
    _Var2._M_p = local_f0._M_dataplus._M_p;
    _Var1._M_head_impl = local_128._M_head_impl;
    local_f0._M_dataplus._M_p = (pointer)0x0;
    local_128._M_head_impl = (MaterializedQueryResult *)_Var2._M_p;
    if (_Var1._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
      if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
      }
    }
    local_f0._M_dataplus._M_p = (pointer)0x0;
    std::__cxx11::string::~string((string *)&new_count);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_128);
    cVar3 = duckdb::BaseQueryResult::HasError();
    if (cVar3 == '\0') {
      pMVar4 = duckdb::
               unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                             *)&local_128);
      duckdb::MaterializedQueryResult::GetValue((ulong)&new_count,(ulong)pMVar4);
      local_f0._M_dataplus._M_p = (pointer)(local_f8 + lVar5);
      cVar3 = duckdb::Value::operator!=(&new_count,(long *)&local_f0);
      if (cVar3 != '\0') {
        local_110[local_120] = false;
      }
      duckdb::Value::operator=(&count,&new_count);
      duckdb::Value::~Value(&new_count);
    }
    else {
      local_110[local_120] = false;
    }
    __val = __val + 1;
  }
  LOCK();
  delete_finished_threads.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)delete_finished_threads.super___atomic_base<int>._M_i + 1);
  UNLOCK();
  do {
  } while (delete_finished_threads.super___atomic_base<int>._M_i != 10);
  std::__cxx11::string::string((string *)&new_count,"COMMIT;",(allocator *)&local_f0);
  duckdb::Connection::Query((string *)&local_108);
  if (local_108 != (long *)0x0) {
    (**(code **)(*local_108 + 8))();
  }
  local_108 = (long *)0x0;
  std::__cxx11::string::~string((string *)&new_count);
  duckdb::Value::~Value(&count);
  if (local_128._M_head_impl != (MaterializedQueryResult *)0x0) {
    (**(code **)(*(long *)local_128._M_head_impl + 8))();
  }
  duckdb::Connection::~Connection(&con);
  return;
}

Assistant:

static void delete_elements(DuckDB *db, bool *correct, size_t threadnr) {
	correct[threadnr] = true;
	Connection con(*db);
	// initial count
	con.Query("BEGIN TRANSACTION;");
	auto result = con.Query("SELECT COUNT(*) FROM integers");
	Value count = result->GetValue(0, 0);
	auto start_count = count.GetValue<int64_t>();

	for (size_t i = 0; i < CONCURRENT_DELETE_INSERT_ELEMENTS; i++) {
		// count should decrease by one for every delete we do
		auto element = CONCURRENT_DELETE_INSERT_ELEMENTS * threadnr + i;
		if (con.Query("DELETE FROM integers WHERE i=" + to_string(element))->HasError()) {
			correct[threadnr] = false;
		}
		result = con.Query("SELECT COUNT(*) FROM integers");
		if (result->HasError()) {
			correct[threadnr] = false;
		} else {
			Value new_count = result->GetValue(0, 0);
			if (new_count != start_count - (i + 1)) {
				correct[threadnr] = false;
			}
			count = new_count;
		}
	}
	delete_finished_threads++;
	while (delete_finished_threads != CONCURRENT_DELETE_THREAD_COUNT)
		;
	con.Query("COMMIT;");
}